

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# format.h
# Opt level: O1

void __thiscall
fmt::v7::detail::
int_writer<std::back_insert_iterator<fmt::v7::detail::buffer<char>_>,_char,_unsigned_long>::on_num
          (int_writer<std::back_insert_iterator<fmt::v7::detail::buffer<char>_>,_char,_unsigned_long>
           *this)

{
  char *pcVar1;
  char cVar2;
  ushort uVar3;
  basic_format_specs<char> *pbVar4;
  bool bVar5;
  long lVar6;
  char cVar7;
  uint uVar8;
  back_insert_iterator<fmt::v7::detail::buffer<char>_> bVar9;
  ulong uVar10;
  ulong uVar11;
  uint uVar12;
  uint uVar13;
  _Alloc_hider _Var14;
  _Alloc_hider _Var15;
  char *pcVar16;
  int iVar17;
  size_type sVar18;
  uint uVar19;
  char *pcVar20;
  int iVar21;
  ulong uVar22;
  uint uVar23;
  string groups;
  char digits [40];
  string local_298;
  char local_278 [48];
  basic_memory_buffer<char,_500UL,_std::allocator<char>_> local_248;
  
  grouping_impl<char>(&local_298,(locale_ref)(this->locale).locale_);
  if (local_298._M_string_length == 0) {
    on_dec(this);
  }
  else {
    cVar7 = thousands_sep_impl<char>((locale_ref)(this->locale).locale_);
    if (cVar7 != '\0') {
      uVar10 = this->abs_value;
      lVar6 = 0x3f;
      if ((uVar10 | 1) != 0) {
        for (; (uVar10 | 1) >> lVar6 == 0; lVar6 = lVar6 + -1) {
        }
      }
      uVar3 = *(ushort *)(bsr2log10(int)::data + (uint)((int)lVar6 * 2));
      uVar23 = (uint)uVar3 -
               (uint)(uVar10 < *(ulong *)(basic_data<void>::zero_or_powers_of_10_64_new +
                                         (ulong)uVar3 * 8));
      iVar21 = -(uint)(uVar10 < *(ulong *)(basic_data<void>::zero_or_powers_of_10_64_new +
                                          (ulong)uVar3 * 8));
      pcVar16 = local_298._M_dataplus._M_p + local_298._M_string_length;
      _Var14._M_p = local_298._M_dataplus._M_p;
      uVar13 = uVar23;
      uVar8 = uVar23;
      if (local_298._M_string_length != 0) {
        _Var15._M_p = local_298._M_dataplus._M_p;
        sVar18 = local_298._M_string_length;
        uVar12 = uVar23;
        do {
          cVar2 = *_Var15._M_p;
          uVar19 = uVar8 - (int)cVar2;
          _Var14._M_p = _Var15._M_p;
          uVar13 = uVar12;
          if ((uVar19 == 0 || (int)uVar8 < (int)cVar2) || ((byte)(cVar2 + 0x81U) < 0x82)) break;
          uVar12 = uVar12 + 1;
          _Var15._M_p = _Var15._M_p + 1;
          sVar18 = sVar18 - 1;
          _Var14._M_p = pcVar16;
          uVar13 = (int)local_298._M_string_length + iVar21 + (uint)uVar3;
          uVar8 = uVar19;
        } while (sVar18 != 0);
      }
      if (_Var14._M_p == pcVar16) {
        uVar13 = uVar13 + (int)(uVar8 - 1) / (int)pcVar16[-1];
      }
      pcVar16 = local_278 + (int)uVar23;
      uVar11 = uVar10;
      if (99 < uVar10) {
        do {
          uVar11 = uVar10 / 100;
          *(undefined2 *)(pcVar16 + -2) =
               *(undefined2 *)(basic_data<void>::digits + (uVar10 % 100) * 2);
          pcVar16 = pcVar16 + -2;
          bVar5 = 9999 < uVar10;
          uVar10 = uVar11;
        } while (bVar5);
      }
      if (uVar11 < 10) {
        pcVar16[-1] = (byte)uVar11 | 0x30;
      }
      else {
        *(undefined2 *)(pcVar16 + -2) = *(undefined2 *)(basic_data<void>::digits + uVar11 * 2);
      }
      local_248.super_buffer<char>.size_ = 0;
      local_248.super_buffer<char>._vptr_buffer = (_func_int **)&PTR_grow_0025b290;
      local_248.super_buffer<char>.ptr_ = local_248.store_;
      local_248.super_buffer<char>.capacity_ = 500;
      uVar13 = uVar13 + this->prefix_size;
      if (-1 < (int)uVar13) {
        uVar10 = (ulong)uVar13;
        if (500 < uVar13) {
          basic_memory_buffer<char,_500UL,_std::allocator<char>_>::grow(&local_248,uVar10);
        }
        pcVar16 = local_248.super_buffer<char>.ptr_;
        local_248.super_buffer<char>.size_ = local_248.super_buffer<char>.capacity_;
        if (uVar10 <= local_248.super_buffer<char>.capacity_) {
          local_248.super_buffer<char>.size_ = uVar10;
        }
        pcVar20 = local_248.super_buffer<char>.ptr_ + (uVar10 - 1);
        if (1 < (int)uVar23) {
          uVar11 = (ulong)uVar23;
          iVar17 = iVar21 + (uint)uVar3 + 1;
          iVar21 = 0;
          _Var14._M_p = local_298._M_dataplus._M_p;
          do {
            uVar11 = uVar11 - 1;
            pcVar1 = pcVar20 + -1;
            *pcVar20 = local_278[uVar11 & 0xffffffff];
            cVar2 = *_Var14._M_p;
            if ('\0' < cVar2) {
              iVar21 = iVar21 + 1;
              if ((cVar2 != '\x7f') && (iVar21 % (int)cVar2 == 0)) {
                if (_Var14._M_p + 1 != local_298._M_dataplus._M_p + local_298._M_string_length) {
                  iVar21 = 0;
                  _Var14._M_p = _Var14._M_p + 1;
                }
                pcVar20[-1] = cVar7;
                pcVar1 = pcVar20 + -2;
              }
            }
            pcVar20 = pcVar1;
            iVar17 = iVar17 + -1;
          } while (2 < iVar17);
        }
        *pcVar20 = local_278[0];
        if (this->prefix_size != 0) {
          pcVar20[-1] = '-';
        }
        pbVar4 = this->specs;
        uVar11 = (ulong)pbVar4->width;
        if (-1 < (long)uVar11) {
          uVar22 = 0;
          if (uVar10 <= uVar11) {
            uVar22 = uVar11 - uVar10;
          }
          uVar11 = uVar22 >> (*(byte *)((long)&basic_data<void>::right_padding_shifts +
                                       (ulong)((byte)pbVar4->field_0x9 & 0xf)) & 0x3f);
          bVar9 = fill<std::back_insert_iterator<fmt::v7::detail::buffer<char>>,char>
                            ((this->out).container,uVar11,&pbVar4->fill);
          bVar9 = std::__copy_move<false,false,std::random_access_iterator_tag>::
                  __copy_m<char*,std::back_insert_iterator<fmt::v7::detail::buffer<char>>>
                            (pcVar16,pcVar16 + uVar10,bVar9);
          bVar9 = fill<std::back_insert_iterator<fmt::v7::detail::buffer<char>>,char>
                            (bVar9,uVar22 - uVar11,&pbVar4->fill);
          (this->out).container = bVar9.container;
          if (local_248.super_buffer<char>.ptr_ != local_248.store_) {
            operator_delete(local_248.super_buffer<char>.ptr_);
          }
          goto LAB_0020c096;
        }
      }
      assert_fail("/workspace/llm4binary/github/license_all_cmakelists_1510/p2pderivatives[P]cfd-js/external/cfd-core/src/include/fmt/core.h"
                  ,0x146,"negative value");
    }
    on_dec(this);
  }
LAB_0020c096:
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_298._M_dataplus._M_p != &local_298.field_2) {
    operator_delete(local_298._M_dataplus._M_p);
  }
  return;
}

Assistant:

void on_num() {
    std::string groups = grouping<Char>(locale);
    if (groups.empty()) return on_dec();
    auto sep = thousands_sep<Char>(locale);
    if (!sep) return on_dec();
    int num_digits = count_digits(abs_value);
    int size = num_digits, n = num_digits;
    std::string::const_iterator group = groups.cbegin();
    while (group != groups.cend() && n > *group && *group > 0 &&
           *group != max_value<char>()) {
      size += sep_size;
      n -= *group;
      ++group;
    }
    if (group == groups.cend()) size += sep_size * ((n - 1) / groups.back());
    char digits[40];
    format_decimal(digits, abs_value, num_digits);
    basic_memory_buffer<Char> buffer;
    size += static_cast<int>(prefix_size);
    const auto usize = to_unsigned(size);
    buffer.resize(usize);
    basic_string_view<Char> s(&sep, sep_size);
    // Index of a decimal digit with the least significant digit having index 0.
    int digit_index = 0;
    group = groups.cbegin();
    auto p = buffer.data() + size - 1;
    for (int i = num_digits - 1; i > 0; --i) {
      *p-- = static_cast<Char>(digits[i]);
      if (*group <= 0 || ++digit_index % *group != 0 ||
          *group == max_value<char>())
        continue;
      if (group + 1 != groups.cend()) {
        digit_index = 0;
        ++group;
      }
      std::uninitialized_copy(s.data(), s.data() + s.size(),
                              make_checked(p, s.size()));
      p -= s.size();
    }
    *p-- = static_cast<Char>(*digits);
    if (prefix_size != 0) *p = static_cast<Char>('-');
    auto data = buffer.data();
    out = write_padded<align::right>(
        out, specs, usize, usize,
        [=](iterator it) { return copy_str<Char>(data, data + size, it); });
  }